

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osportable.cc
# Opt level: O0

void resolve_path(char *buf,size_t buflen,char *path)

{
  bool bVar1;
  size_t sVar2;
  pointer pcVar3;
  unique_ptr<char,_void_(*)(void_*)> *puVar4;
  char *in_RDX;
  unique_ptr<char,_void_(*)(void_*)> *in_RSI;
  pointer in_RDI;
  unique_ptr<char,_void_(*)(void_*)> rpath;
  char sl;
  char *suffix;
  __array mypath;
  size_t pathl;
  pointer in_stack_ffffffffffffff48;
  unique_ptr<char,_void_(*)(void_*)> *in_stack_ffffffffffffff50;
  unique_ptr<char,_void_(*)(void_*)> *in_stack_ffffffffffffff58;
  unique_ptr<char,_void_(*)(void_*)> *in_stack_ffffffffffffff60;
  undefined7 in_stack_ffffffffffffff68;
  undefined1 in_stack_ffffffffffffff6f;
  char local_31;
  unique_ptr<char,_void_(*)(void_*)> *local_30;
  
  sVar2 = strlen(in_RDX);
  std::make_unique<char[]>(CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
  pcVar3 = std::unique_ptr<char[],_std::default_delete<char[]>_>::get
                     ((unique_ptr<char[],_std::default_delete<char[]>_> *)in_stack_ffffffffffffff50)
  ;
  memcpy(pcVar3,in_RDX,sVar2 + 1);
  pcVar3 = std::unique_ptr<char[],_std::default_delete<char[]>_>::get
                     ((unique_ptr<char[],_std::default_delete<char[]>_> *)in_stack_ffffffffffffff50)
  ;
  local_30 = (unique_ptr<char,_void_(*)(void_*)> *)(pcVar3 + sVar2);
  local_31 = '\0';
  do {
    pcVar3 = std::unique_ptr<char[],_std::default_delete<char[]>_>::get
                       ((unique_ptr<char[],_std::default_delete<char[]>_> *)
                        in_stack_ffffffffffffff50);
    realpath(pcVar3,(char *)0x0);
    std::unique_ptr<char,void(*)(void*)>::unique_ptr<void(*)(void*),void>
              (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
               (__enable_if_t<_is_lvalue_reference<void_(*)(void_*)>::value,_void_(*&&)(void_*)>)
               0x1fc952);
    *(char *)&(local_30->_M_t).super___uniq_ptr_impl<char,_void_(*)(void_*)>._M_t.
              super__Tuple_impl<0UL,_char_*,_void_(*)(void_*)>.
              super__Tuple_impl<1UL,_void_(*)(void_*)>.
              super__Head_base<1UL,_void_(*)(void_*),_false>._M_head_impl = local_31;
    bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr<char,_void_(*)(void_*)> *)0x1fc96d);
    if (bVar1) {
      if (*(char *)&(local_30->_M_t).super___uniq_ptr_impl<char,_void_(*)(void_*)>._M_t.
                    super__Tuple_impl<0UL,_char_*,_void_(*)(void_*)>.
                    super__Tuple_impl<1UL,_void_(*)(void_*)>.
                    super__Head_base<1UL,_void_(*)(void_*),_false>._M_head_impl == '\0') {
        std::unique_ptr<char,_void_(*)(void_*)>::get(in_stack_ffffffffffffff50);
        safe_strcpy((char *)in_stack_ffffffffffffff60,(size_t)in_stack_ffffffffffffff58,
                    (char *)in_stack_ffffffffffffff50);
      }
      else {
        while (*(char *)&(local_30->_M_t).super___uniq_ptr_impl<char,_void_(*)(void_*)>._M_t.
                         super__Tuple_impl<0UL,_char_*,_void_(*)(void_*)>.
                         super__Tuple_impl<1UL,_void_(*)(void_*)>.
                         super__Head_base<1UL,_void_(*)(void_*),_false>._M_head_impl == '/') {
          local_30 = (unique_ptr<char,_void_(*)(void_*)> *)
                     ((long)&(local_30->_M_t).super___uniq_ptr_impl<char,_void_(*)(void_*)>._M_t.
                             super__Tuple_impl<0UL,_char_*,_void_(*)(void_*)>.
                             super__Tuple_impl<1UL,_void_(*)(void_*)>.
                             super__Head_base<1UL,_void_(*)(void_*),_false>._M_head_impl + 1);
        }
        std::unique_ptr<char,_void_(*)(void_*)>::get(in_stack_ffffffffffffff50);
        os_build_full_path((char *)in_stack_ffffffffffffff60,(size_t)in_stack_ffffffffffffff58,
                           (char *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
      }
      bVar1 = true;
    }
    else {
      while( true ) {
        puVar4 = (unique_ptr<char,_void_(*)(void_*)> *)
                 std::unique_ptr<char[],_std::default_delete<char[]>_>::get
                           ((unique_ptr<char[],_std::default_delete<char[]>_> *)
                            in_stack_ffffffffffffff50);
        bVar1 = false;
        if (puVar4 < local_30) {
          bVar1 = *(char *)((long)&local_30[-1]._M_t.super___uniq_ptr_impl<char,_void_(*)(void_*)>.
                                   _M_t.super__Tuple_impl<0UL,_char_*,_void_(*)(void_*)>.
                                   super__Head_base<0UL,_char_*,_false>._M_head_impl + 7) != '/';
        }
        if (!bVar1) break;
        local_30 = (unique_ptr<char,_void_(*)(void_*)> *)
                   ((long)&local_30[-1]._M_t.super___uniq_ptr_impl<char,_void_(*)(void_*)>._M_t.
                           super__Tuple_impl<0UL,_char_*,_void_(*)(void_*)>.
                           super__Head_base<0UL,_char_*,_false>._M_head_impl + 7);
      }
      while( true ) {
        in_stack_ffffffffffffff60 = local_30;
        puVar4 = (unique_ptr<char,_void_(*)(void_*)> *)
                 std::unique_ptr<char[],_std::default_delete<char[]>_>::get
                           ((unique_ptr<char[],_std::default_delete<char[]>_> *)
                            in_stack_ffffffffffffff50);
        bVar1 = false;
        if (puVar4 < in_stack_ffffffffffffff60) {
          bVar1 = *(char *)((long)&local_30[-1]._M_t.super___uniq_ptr_impl<char,_void_(*)(void_*)>.
                                   _M_t.super__Tuple_impl<0UL,_char_*,_void_(*)(void_*)>.
                                   super__Head_base<0UL,_char_*,_false>._M_head_impl + 7) == '/';
        }
        if (!bVar1) break;
        local_30 = (unique_ptr<char,_void_(*)(void_*)> *)
                   ((long)&local_30[-1]._M_t.super___uniq_ptr_impl<char,_void_(*)(void_*)>._M_t.
                           super__Tuple_impl<0UL,_char_*,_void_(*)(void_*)>.
                           super__Head_base<0UL,_char_*,_false>._M_head_impl + 7);
      }
      in_stack_ffffffffffffff58 = local_30;
      puVar4 = (unique_ptr<char,_void_(*)(void_*)> *)
               std::unique_ptr<char[],_std::default_delete<char[]>_>::get
                         ((unique_ptr<char[],_std::default_delete<char[]>_> *)
                          in_stack_ffffffffffffff50);
      if (in_stack_ffffffffffffff58 == puVar4) {
        in_stack_ffffffffffffff48 = in_RDI;
        in_stack_ffffffffffffff50 = in_RSI;
        std::unique_ptr<char[],_std::default_delete<char[]>_>::get
                  ((unique_ptr<char[],_std::default_delete<char[]>_> *)in_RSI);
        safe_strcpy((char *)in_stack_ffffffffffffff60,(size_t)in_stack_ffffffffffffff58,
                    (char *)in_stack_ffffffffffffff50);
        bVar1 = true;
      }
      else {
        local_31 = *(char *)&(local_30->_M_t).super___uniq_ptr_impl<char,_void_(*)(void_*)>._M_t.
                             super__Tuple_impl<0UL,_char_*,_void_(*)(void_*)>.
                             super__Tuple_impl<1UL,_void_(*)(void_*)>.
                             super__Head_base<1UL,_void_(*)(void_*),_false>._M_head_impl;
        *(char *)&(local_30->_M_t).super___uniq_ptr_impl<char,_void_(*)(void_*)>._M_t.
                  super__Tuple_impl<0UL,_char_*,_void_(*)(void_*)>.
                  super__Tuple_impl<1UL,_void_(*)(void_*)>.
                  super__Head_base<1UL,_void_(*)(void_*),_false>._M_head_impl = '\0';
        bVar1 = false;
      }
    }
    std::unique_ptr<char,_void_(*)(void_*)>::~unique_ptr(in_stack_ffffffffffffff60);
  } while (!bVar1);
  std::unique_ptr<char[],_std::default_delete<char[]>_>::~unique_ptr
            ((unique_ptr<char[],_std::default_delete<char[]>_> *)in_stack_ffffffffffffff50);
  return;
}

Assistant:

static void
resolve_path( char *buf, size_t buflen, const char *path )
{
    // Starting with the full path string, try resolving the path with
    // realpath().  The tricky bit is that realpath() will fail if any
    // component of the path doesn't exist, but we need to resolve paths
    // for prospective filenames, such as files or directories we're
    // about to create.  So if realpath() fails, remove the last path
    // component and try again with the remainder.  Repeat until we
    // can resolve a real path, or run out of components to remove.
    // The point of this algorithm is that it will resolve as much of
    // the path as actually exists in the file system, ensuring that
    // we resolve any links that affect the path.  Any portion of the
    // path that doesn't exist obviously can't refer to a link, so it
    // will be taken literally.  Once we've resolved the longest prefix,
    // tack the stripped portion back on to form the fully resolved
    // path.

    // make a writable copy of the path to work with
    size_t pathl = strlen(path);
    const auto mypath = std::make_unique<char[]>(pathl + 1);
    memcpy(mypath.get(), path, pathl + 1);

    // start at the very end of the path, with no stripped suffix yet
    char *suffix = mypath.get() + pathl;
    char sl = '\0';

    // keep going until we resolve something or run out of path
    for (;;)
    {
        // resolve the current prefix, allocating the result
        const std::unique_ptr<char, decltype(&free)>
                rpath(realpath(mypath.get(), 0), &free);

        // un-split the path
        *suffix = sl;

        // if we resolved the prefix, return the result
        if (rpath)
        {
            // success - if we separated a suffix, reattach it
            if (*suffix != '\0')
            {
                // reattach the suffix (the part after the '/')
                for ( ; *suffix == '/' ; ++suffix) ;
                os_build_full_path(buf, buflen, rpath.get(), suffix);
            }
            else
            {
                // no suffix, so we resolved the entire path
                safe_strcpy(buf, buflen, rpath.get());
            }

            // done searching
            break;
        }

        // no luck with realpath(); search for the '/' at the end of the
        // previous component in the path 
        for ( ; suffix > mypath.get() && *(suffix-1) != '/' ; --suffix) ;

        // skip any redundant slashes
        for ( ; suffix > mypath.get() && *(suffix-1) == '/' ; --suffix) ;

        // if we're at the root element, we're out of path elements
        if (suffix == mypath.get())
        {
            // we can't resolve any part of the path, so just return the
            // original path unchanged
            safe_strcpy(buf, buflen, mypath.get());
            break;
        }

        // split the path here into prefix and suffix, and try again
        sl = *suffix;
        *suffix = '\0';
    }
}